

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O3

mraa_result_t mraa_gpio_edge_mode(mraa_gpio_context dev,mraa_gpio_edge_t mode)

{
  uint uVar1;
  _func_mraa_result_t_mraa_gpio_context_mraa_gpio_edge_t *UNRECOVERED_JUMPTABLE;
  undefined1 auVar2 [16];
  mraa_result_t mVar3;
  int iVar4;
  mraa_gpio_events_t pmVar5;
  ssize_t sVar6;
  int *piVar7;
  char *pcVar8;
  ulong uVar9;
  size_t __n;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  char bu [64];
  char filepath [64];
  undefined8 local_b8;
  char local_78 [72];
  
  if (dev == (mraa_gpio_context)0x0) {
    syslog(3,"gpio: edge_mode: context is invalid");
    mVar3 = MRAA_ERROR_INVALID_HANDLE;
  }
  else {
    if ((dev->advance_func != (mraa_adv_func_t *)0x0) &&
       (UNRECOVERED_JUMPTABLE = dev->advance_func->gpio_edge_mode_replace,
       UNRECOVERED_JUMPTABLE != (_func_mraa_result_t_mraa_gpio_context_mraa_gpio_edge_t *)0x0)) {
      mVar3 = (*UNRECOVERED_JUMPTABLE)(dev,mode);
      return mVar3;
    }
    if ((mode != MRAA_GPIO_EDGE_NONE) && (dev->events == (mraa_gpio_events_t)0x0)) {
      uVar10 = (ulong)dev->num_pins;
      pmVar5 = (mraa_gpio_events_t)malloc(uVar10 * 0x10);
      dev->events = pmVar5;
      auVar2 = _DAT_00123a40;
      if (pmVar5 == (mraa_gpio_events_t)0x0) {
        syslog(3,"mraa_gpio_edge_mode() malloc error");
        return MRAA_ERROR_NO_RESOURCES;
      }
      if (uVar10 != 0) {
        lVar11 = uVar10 - 1;
        auVar12._8_4_ = (int)lVar11;
        auVar12._0_8_ = lVar11;
        auVar12._12_4_ = (int)((ulong)lVar11 >> 0x20);
        uVar9 = 0;
        auVar12 = auVar12 ^ _DAT_00123a40;
        auVar13 = _DAT_00123a20;
        auVar14 = _DAT_00123a30;
        do {
          auVar15 = auVar14 ^ auVar2;
          iVar4 = auVar12._4_4_;
          if ((bool)(~(auVar15._4_4_ == iVar4 && auVar12._0_4_ < auVar15._0_4_ ||
                      iVar4 < auVar15._4_4_) & 1)) {
            *(undefined4 *)((long)&pmVar5->id + uVar9) = 0xffffffff;
          }
          if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
              auVar15._12_4_ <= auVar12._12_4_) {
            *(undefined4 *)((long)&pmVar5[1].id + uVar9) = 0xffffffff;
          }
          auVar15 = auVar13 ^ auVar2;
          iVar16 = auVar15._4_4_;
          if (iVar16 <= iVar4 && (iVar16 != iVar4 || auVar15._0_4_ <= auVar12._0_4_)) {
            *(undefined4 *)((long)&pmVar5[2].id + uVar9) = 0xffffffff;
            *(undefined4 *)((long)&pmVar5[3].id + uVar9) = 0xffffffff;
          }
          lVar11 = auVar14._8_8_;
          auVar14._0_8_ = auVar14._0_8_ + 4;
          auVar14._8_8_ = lVar11 + 4;
          lVar11 = auVar13._8_8_;
          auVar13._0_8_ = auVar13._0_8_ + 4;
          auVar13._8_8_ = lVar11 + 4;
          uVar9 = uVar9 + 0x40;
        } while ((uVar10 * 0x10 + 0x30 & 0xffffffffffffffc0) != uVar9);
      }
    }
    if (plat->chardev_capable != 0) {
      mVar3 = mraa_gpio_chardev_edge_mode(dev,mode);
      return mVar3;
    }
    do {
      if (dev->value_fp != -1) {
        close(dev->value_fp);
        dev->value_fp = -1;
      }
      snprintf(local_78,0x40,"/sys/class/gpio/gpio%d/edge",(ulong)(uint)dev->pin);
      iVar4 = open(local_78,2);
      if (iVar4 == -1) {
        uVar1 = dev->pin;
        piVar7 = __errno_location();
        pcVar8 = strerror(*piVar7);
        syslog(3,"gpio%i: edge_mode: Failed to open \'edge\' for writing: %s",(ulong)uVar1,pcVar8);
        return MRAA_ERROR_INVALID_RESOURCE;
      }
      switch(mode) {
      case MRAA_GPIO_EDGE_NONE:
        local_b8 = (ulong)local_b8._5_3_ << 0x28;
        local_b8 = CONCAT44(local_b8._4_4_,0x656e6f6e);
        goto LAB_0010ad7c;
      case MRAA_GPIO_EDGE_BOTH:
        local_b8 = (ulong)local_b8._5_3_ << 0x28;
        local_b8 = CONCAT44(local_b8._4_4_,0x68746f62);
LAB_0010ad7c:
        __n = 4;
        break;
      case MRAA_GPIO_EDGE_RISING:
        local_b8 = CONCAT17(local_b8._7_1_,0x676e69000000);
        local_b8 = CONCAT44(local_b8._4_4_,0x69736972);
        __n = 6;
        break;
      case MRAA_GPIO_EDGE_FALLING:
        local_b8 = 0x676e696c6c6166;
        __n = 7;
        break;
      default:
        mVar3 = MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
        goto LAB_0010ae30;
      }
      sVar6 = write(iVar4,&local_b8,__n);
      if (sVar6 == -1) {
        uVar1 = dev->pin;
        piVar7 = __errno_location();
        pcVar8 = strerror(*piVar7);
        syslog(3,"gpio%i: edge_mode: Failed to write to \'edge\': %s",(ulong)uVar1,pcVar8);
        mVar3 = MRAA_ERROR_UNSPECIFIED;
LAB_0010ae30:
        close(iVar4);
        return mVar3;
      }
      close(iVar4);
      dev = dev->next;
    } while (dev != (_gpio *)0x0);
    mVar3 = MRAA_SUCCESS;
  }
  return mVar3;
}

Assistant:

mraa_result_t
mraa_gpio_edge_mode(mraa_gpio_context dev, mraa_gpio_edge_t mode)
{
    if (dev == NULL) {
        syslog(LOG_ERR, "gpio: edge_mode: context is invalid");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (IS_FUNC_DEFINED(dev, gpio_edge_mode_replace))
        return dev->advance_func->gpio_edge_mode_replace(dev, mode);

    /* Initialize events array. */
    if (dev->events == NULL && mode != MRAA_GPIO_EDGE_NONE) {
        dev->events = malloc(dev->num_pins * sizeof(mraa_gpio_event));
        if (dev->events == NULL) {
            syslog(LOG_ERR, "mraa_gpio_edge_mode() malloc error");
            return MRAA_ERROR_NO_RESOURCES;
        }

        for (int i = 0; i < dev->num_pins; ++i) {
            dev->events[i].id = -1;
        }
    }

    if (plat->chardev_capable)
        return mraa_gpio_chardev_edge_mode(dev, mode);

    mraa_gpio_context it = dev;

    while (it) {

        if (it->value_fp != -1) {
            close(it->value_fp);
            it->value_fp = -1;
        }

        char filepath[MAX_SIZE];
        snprintf(filepath, MAX_SIZE, SYSFS_CLASS_GPIO "/gpio%d/edge", it->pin);

        int edge = open(filepath, O_RDWR);
        if (edge == -1) {
            syslog(LOG_ERR, "gpio%i: edge_mode: Failed to open 'edge' for writing: %s", it->pin,
                   strerror(errno));
            return MRAA_ERROR_INVALID_RESOURCE;
        }

        char bu[MAX_SIZE];
        int length;
        switch (mode) {
            case MRAA_GPIO_EDGE_NONE:
                length = snprintf(bu, sizeof(bu), "none");
                break;
            case MRAA_GPIO_EDGE_BOTH:
                length = snprintf(bu, sizeof(bu), "both");
                break;
            case MRAA_GPIO_EDGE_RISING:
                length = snprintf(bu, sizeof(bu), "rising");
                break;
            case MRAA_GPIO_EDGE_FALLING:
                length = snprintf(bu, sizeof(bu), "falling");
                break;
            default:
                close(edge);
                return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
        }
        if (write(edge, bu, length * sizeof(char)) == -1) {
            syslog(LOG_ERR, "gpio%i: edge_mode: Failed to write to 'edge': %s", it->pin, strerror(errno));
            close(edge);
            return MRAA_ERROR_UNSPECIFIED;
        }

        close(edge);

        it = it->next;
    }

    return MRAA_SUCCESS;
}